

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O1

void CVmBifTIO::askfile(uint argc)

{
  CVmObjPageEntry *this;
  bool bVar1;
  byte bVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_val_t *pvVar4;
  undefined8 uVar5;
  bool bVar6;
  vm_val_t *pvVar7;
  int prompt_type;
  int file_type;
  int iVar8;
  vm_obj_id_t vVar9;
  uint uVar10;
  vm_obj_id_t vVar11;
  FILE *__stream;
  char *pcVar12;
  size_t sVar13;
  char *paramlen;
  ulong uVar14;
  CVmConsoleMain *pCVar15;
  long *in_FS_OFFSET;
  vm_val_t val;
  char *fname2;
  unsigned_long attrs;
  int evt;
  char prompt [256];
  char fullprompt [4501];
  char warning [4351];
  char fname [12289];
  
  memset(warning,0,0x10ff);
  CVmBif::check_argc(argc,4);
  CVmBif::pop_str_val_ui(prompt,0x100);
  prompt_type = CVmBif::pop_int_val();
  file_type = CVmBif::pop_int_val();
  CVmBif::pop_long_val();
  bVar6 = true;
  iVar8 = CVmConsole::read_event_script
                    (&G_console_X->super_CVmConsole,&evt,fname,0x3001,askfile::filter,1,&attrs);
  pCVar15 = G_console_X;
  if (iVar8 == 0) {
    if (G_net_config_X == (TadsNetConfig *)0x0) {
      sVar13 = strlen(prompt);
      vVar9 = CVmConsole::askfile(&pCVar15->super_CVmConsole,prompt,sVar13,fname,0x3001,prompt_type,
                                  file_type,0);
      bVar6 = false;
    }
    else {
      pcVar12 = TadsNetConfig::get(G_net_config_X,"hostname");
      bVar6 = true;
      if (pcVar12 != (char *)0x0) {
        bVar1 = true;
        vVar9 = 1;
        goto LAB_00231731;
      }
      vVar9 = osnet_askfile(prompt,fname,0x3001,prompt_type,file_type);
      bVar6 = true;
    }
    bVar1 = true;
  }
  else {
    bVar2 = 1;
    if ((prompt_type == 2 && fname[0] != '\0') && (((byte)attrs & 1) == 0)) {
      iVar8 = CVmNetFile::exists(fname,0);
      if (iVar8 != 0) {
        bVar2 = 0;
        t3sprintf(warning,0x10ff,"OV The script might overwrite the file %s. ",fname);
        bVar6 = false;
      }
    }
    if ((bool)(prompt_type == 2 & bVar2 & fname[0] != '\0')) {
      iVar8 = CVmNetFile::can_write(fname,0);
      bVar6 = true;
      if (iVar8 == 0) {
        __stream = fopen(fname,"wb");
        if (__stream == (FILE *)0x0) {
          bVar6 = false;
          t3sprintf(warning,0x10ff,
                    "WR The script is attempting to write file %s, but that file cannot be written."
                    ,fname);
        }
        else {
          fclose(__stream);
          remove(fname);
        }
      }
    }
    if ((bool)(prompt_type == 1 & bVar6 & fname[0] != '\0')) {
      iVar8 = CVmNetFile::exists(fname,0);
      bVar6 = true;
      if (iVar8 == 0) {
        t3sprintf(warning,0x10ff,
                  "RD The script is attempting to open file %s, but this file doesn\'t exist or isn\'t readable."
                  ,fname);
        bVar6 = false;
      }
    }
    vVar9 = (uint)(fname[0] == '\0') * 2;
    bVar1 = false;
    if ((!bVar6) && (bVar1 = false, G_net_config_X == (TadsNetConfig *)0x0)) {
      t3sprintf(fullprompt,0x1195,
                "%s Do you wish to proceed? Select Yes to proceed with this file, No to choose a different file, or Cancel to stop replaying this script."
                ,warning + 3);
      bVar6 = true;
      do {
        bVar1 = bVar6;
        iVar8 = CVmConsole::input_dialog
                          (&G_console_X->super_CVmConsole,1,fullprompt,4,(char **)0x0,0,2,3,1);
        pCVar15 = G_console_X;
        if (iVar8 != 2) {
          vVar11 = 2;
          if (iVar8 == 3) goto LAB_002316fe;
          goto LAB_0023171d;
        }
        sVar13 = strlen(prompt);
        vVar9 = CVmConsole::askfile(&pCVar15->super_CVmConsole,prompt,sVar13,fname,0x3001,
                                    prompt_type,file_type,1);
        bVar1 = false;
        bVar6 = false;
      } while (vVar9 == 2);
      vVar11 = vVar9;
      if (vVar9 == 1) {
LAB_002316fe:
        vVar9 = vVar11;
        uVar10 = CVmConsole::close_script_file(&G_console_X->super_CVmConsole);
        (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[4])(G_console_X,(ulong)uVar10);
      }
LAB_0023171d:
      warning[0] = '\0';
      bVar1 = !bVar1;
    }
    bVar6 = true;
  }
LAB_00231731:
  vVar11 = CVmObjList::create(0,(ulong)(vVar9 == 0) * 3 + 1);
  this = G_obj_table_X.pages_[vVar11 >> 0xc] + (vVar11 & 0xfff);
  uVar14 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
  if (uVar14 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this,0,uVar14 - 1);
  }
  pvVar4 = sp_;
  aVar3._4_4_ = val.val._4_4_;
  aVar3.obj = vVar11;
  pvVar7 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(val._4_4_,5);
  sp_ = pvVar7;
  pvVar4->val = aVar3;
  val.typ = VM_INT;
  val.val.obj = vVar9;
  CVmObjList::cons_set_element((CVmObjList *)this,0,&val);
  if (vVar9 == 0) {
    fname2 = (char *)0x0;
    G_err_frame::__tls_init();
    fullprompt._8_8_ = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)fullprompt;
    fullprompt._0_4_ = _setjmp((__jmp_buf_tag *)(fullprompt + 0x18));
    if (fullprompt._0_4_ == 0) {
      pcVar12 = fname;
      if (!bVar1) {
        CCharmapToUni::map_str_alo(G_cmap_from_ui_X,&fname2,fname);
        pcVar12 = fname2;
      }
      sVar13 = strlen(pcVar12);
      val.val.obj = CVmObjFileName::create_from_local(pcVar12,sVar13);
      val.typ = VM_OBJ;
      if (!bVar6) {
        (**(code **)(*(long *)&G_obj_table_X.pages_[val.val.obj >> 0xc][val.val.obj & 0xfff].ptr_ +
                    8))(G_obj_table_X.pages_[val.val.obj >> 0xc] + (val.val.obj & 0xfff),
                        CVmObjFileName::metaclass_reg_);
        *(char *)(*(long *)((long)&G_obj_table_X.pages_[val.val.obj >> 0xc][val.val.obj & 0xfff].
                                   ptr_ + 8) + 5) = (char)prompt_type;
      }
    }
    if (-1 < (short)fullprompt._0_4_) {
      fullprompt._0_4_ = fullprompt._0_4_ | 0x8000;
      lib_free_str(fname2);
    }
    uVar5 = fullprompt._8_8_;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = uVar5;
    if ((fullprompt._0_4_ & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      uVar5 = fullprompt._16_8_;
      G_err_frame::__tls_init();
      *(undefined8 *)(*in_FS_OFFSET + 0x10) = uVar5;
      err_rethrow();
    }
    if ((fullprompt._0_4_ & 2) != 0) {
      free((void *)fullprompt._16_8_);
    }
    CVmObjList::cons_set_element((CVmObjList *)this,1,&val);
    val.typ = VM_NIL;
    CVmObjList::cons_set_element((CVmObjList *)this,2,&val);
    if (warning[0] == '\0') {
      val.typ = VM_NIL;
    }
    else {
      val.val.obj = CVmBif::str_from_ui_str(warning);
      val.typ = VM_OBJ;
    }
    CVmObjList::cons_set_element((CVmObjList *)this,3,&val);
    pCVar15 = G_console_X;
    pcVar12 = fname;
    paramlen = (char *)strlen(pcVar12);
  }
  else {
    paramlen = (char *)0x0;
    pcVar12 = paramlen;
    pCVar15 = G_console_X;
  }
  CVmConsole::log_event(&pCVar15->super_CVmConsole,0x2712,pcVar12,(size_t)paramlen,0);
  CVmBif::retval_obj(vVar11);
  sp_ = sp_ + -1;
  return;
}

Assistant:

void CVmBifTIO::askfile(VMG_ uint argc)
{
    char prompt[256];
    int dialog_type;
    os_filetype_t file_type;
    int result;
    char fname[OSFNMAX*3 + 1];
    vm_obj_id_t lst_obj;
    CVmObjList *lst;
    vm_val_t val;
    int from_script = FALSE;
    char warning[OSFNMAX + 255] = "";
    int from_ui = FALSE;
    
    /* check arguments */
    check_argc(vmg_ argc, 4);

    /* get the prompt string */
    pop_str_val_ui(vmg_ prompt, sizeof(prompt));

    /* get the dialog type and file type */
    dialog_type = pop_int_val(vmg0_);
    file_type = (os_filetype_t)pop_int_val(vmg0_);

    /* 
     *   Pop and discard the flags.  (This argument isn't used currently;
     *   it's just there in case we need some option flags in the future.
     *   Pop it as an integer to ensure the caller specified the correct
     *   type, but discard the value.)
     */
    (void)pop_long_val(vmg0_);

    /* check for a script response */
    static int filter[] = { VMCON_EVT_FILE };
    int evt;
    unsigned long attrs;
    if (G_console->read_event_script(
        vmg_ &evt, fname, sizeof(fname), filter, countof(filter), &attrs))
    {
        int ok = TRUE;
        
        /* we got a response from the script */
        from_script = TRUE;
        result = (fname[0] != '\0' ? OS_AFE_SUCCESS : OS_AFE_CANCEL);

        /* 
         *   If this is a "save" prompt, and the OVERWRITE flag isn't set,
         *   and the file already exists, show an interactive warning that
         *   we're about to ovewrite the file.  
         */
        if (ok
            && dialog_type == OS_AFP_SAVE
            && result == OS_AFE_SUCCESS
            && (attrs & VMCON_EVTATTR_OVERWRITE) == 0
            && CVmNetFile::exists(vmg_ fname, 0))
        {
            /* the file exists - warn about the overwrite */
            ok = FALSE;
            t3sprintf(warning, sizeof(warning),
                      "OV The script might overwrite the file %s. ", fname);
        }

        /* 
         *   If this is a "save" prompt, check to see if we can write the
         *   file, and warn if not.
         */
        if (ok
            && dialog_type == OS_AFP_SAVE
            && result == OS_AFE_SUCCESS
            && !CVmNetFile::can_write(vmg_ fname, 0))
        {
            /* try creating the file */
            osfildef *fp = osfopwb(fname, file_type);

            /* if that succeeded, undo the creation; otherwise warn */
            if (fp != 0)
            {
                /* it worked - close and delete the test file */
                osfcls(fp);
                osfdel(fname);
            }
            else
            {
                /* didn't work - warn about it */
                ok = FALSE;
                t3sprintf(warning, sizeof(warning),
                          "WR The script is attempting to write file %s, "
                          "but that file cannot be written.", fname);
            }
        }

        /*
         *   If this is an "open" prompt, and the file isn't readable, warn
         *   about it.  
         */
        if (ok
            && dialog_type == OS_AFP_OPEN
            && result == OS_AFE_SUCCESS
            && !CVmNetFile::exists(vmg_ fname, 0))
        {
            ok = FALSE;
            t3sprintf(warning, sizeof(warning),
                      "RD The script is attempting to open file %s, "
                      "but this file doesn't exist or isn't readable.",
                      fname);
        }

        /* 
         *   If we generated a warning, and we're not in Web UI mode, display
         *   the warning as a Yes/No/Cancel console input dialog.  We can't
         *   do this in Web UI mode, since we can't use the regular console
         *   in Web mode.  Instead, we'll return the warning information to
         *   the caller for display.  
         */
        if (!ok && G_net_config == 0)
        {
            char fullprompt[OSFNMAX + 255 + 150];

            /* build the full prompt */
            t3sprintf(fullprompt, sizeof(fullprompt),
                      "%s Do you wish to proceed? Select Yes to "
                      "proceed with this file, No to choose a different "
                      "file, or Cancel to stop replaying this script.",
                      warning + 3);

            /* 
             *   display a dialog - note that this goes directly to user,
             *   bypassing the active script, since this is a question about
             *   how to handle a problem in the script 
             */
        show_warning:
            switch (G_console->input_dialog(
                vmg_ OS_INDLG_ICON_WARNING, fullprompt,
                OS_INDLG_YESNOCANCEL, 0, 0, 2, 3, TRUE))
            {
            case 1:
                /* yes - proceed with fname */
                break;

            case 2:
                /* no - ask for a new file */
                result = G_console->askfile(
                    vmg_ prompt, strlen(prompt),
                    fname, sizeof(fname), dialog_type, file_type, TRUE);

                /* this didn't come from the script after all */
                from_script = FALSE;

                /* 
                 *   If they canceled the file selection, go back to the
                 *   warning dialog; if the dialog itself failed, cancel the
                 *   script entirely.  If they selected a file, proceed with
                 *   their new file replacing the script input.  Note that we
                 *   don't have to repeat the tests above on the new file,
                 *   since the user explicitly entered it and thus presumably
                 *   knows that it's the one they really want to use.  
                 */
                if (result == OS_AFE_CANCEL)
                    goto show_warning;
                else if (result == OS_AFE_FAILURE)
                    close_script_file(vmg0_);

                /* handled */
                break;

            case 3:
                /* cancel - stop the script playback */
                close_script_file(vmg0_);

                /* indicate cancellation */
                result = OS_AFE_CANCEL;
                break;
            }

            /* we've displayed the warning, so don't return it */
            warning[0] = '\0';
        }
    }
    else if (G_net_config != 0)
    {
#ifdef TADSNET
        /*
         *   If we're running in the local stand-alone configuration, we have
         *   a bit of a special case: we're accessing files on the local file
         *   system, but we're presenting the rest of the program's UI
         *   through a browser window, which might be in a separate child
         *   process; we have to present the file dialog UI in the same
         *   manner.  We have a special OS function for this situation.
         *   
         *   This only applies in the stand-alone configuration, where we
         *   have no "hostname" parameter in the net config.  If we have a
         *   hostname, it means that we're operating in full client/server
         *   mode, in which case we go through the Web UI directly.  
         */
        if (G_net_config->get("hostname") == 0)
        {
            result = osnet_askfile(prompt, fname, sizeof(fname),
                                   dialog_type, file_type);
        }
        else
#endif
        {
            /* there's no console in web host mode - return eof */
            result = OS_AFE_FAILURE;
        }
    }
    else
    {
        /* ask for a file via the console UI */
        result = G_console->askfile(
            vmg_ prompt, strlen(prompt),
            fname, sizeof(fname), dialog_type, file_type);

        /* this file came from the console UI */
        from_ui = TRUE;
    }